

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsDefinePropertyCommon
          (ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
          JsValueRef propertyDescriptor,bool *result)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyId propId;
  ThreadContext *this;
  undefined4 *puVar4;
  RecyclableObject *obj;
  undefined1 local_68 [8];
  PropertyDescriptor propertyDescriptorValue;
  bool *result_local;
  JsValueRef propertyDescriptor_local;
  PropertyRecord *propertyRecord_local;
  JsValueRef object_local;
  ScriptContext *scriptContext_local;
  
  propertyDescriptorValue._40_8_ = result;
  this = Js::ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x75f,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_68);
  BVar3 = Js::JavascriptOperators::ToPropertyDescriptor
                    (propertyDescriptor,(PropertyDescriptor *)local_68,scriptContext);
  if (BVar3 == 0) {
    scriptContext_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    obj = Js::VarTo<Js::RecyclableObject>(object);
    propId = Js::PropertyRecord::GetPropertyId(propertyRecord);
    BVar3 = Js::JavascriptOperators::DefineOwnPropertyDescriptor
                      (obj,propId,(PropertyDescriptor *)local_68,true,scriptContext,
                       PropertyOperation_None);
    *(bool *)propertyDescriptorValue._40_8_ = BVar3 != 0;
    scriptContext_local._4_4_ = JsNoError;
  }
  return scriptContext_local._4_4_;
}

Assistant:

static JsErrorCode JsDefinePropertyCommon(Js::ScriptContext * scriptContext, _In_ JsValueRef object,
    _In_ const Js::PropertyRecord *propertyRecord, _In_ JsValueRef propertyDescriptor,
    _Out_ bool *result)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    Js::PropertyDescriptor propertyDescriptorValue;
    if (!Js::JavascriptOperators::ToPropertyDescriptor(propertyDescriptor, &propertyDescriptorValue, scriptContext))
    {
        return JsErrorInvalidArgument;
    }

    *result = Js::JavascriptOperators::DefineOwnPropertyDescriptor(
        Js::VarTo<Js::RecyclableObject>(object), propertyRecord->GetPropertyId(),
        propertyDescriptorValue, true, scriptContext) != 0;

    return JsNoError;
}